

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O3

void __thiscall
helics::TimeCoordinator::setProperty(TimeCoordinator *this,int timeProperty,Time propertyVal)

{
  Time TVar1;
  
  if (timeProperty < 0x8d) {
    if (timeProperty == 0x89) {
      TVar1.internalTimeCode = 1;
      if (1 < propertyVal.internalTimeCode) {
        TVar1.internalTimeCode = propertyVal.internalTimeCode;
      }
      (this->info).timeDelta.internalTimeCode = TVar1.internalTimeCode;
      return;
    }
    if (timeProperty == 0x8c) {
      (this->info).period.internalTimeCode = propertyVal.internalTimeCode;
      return;
    }
  }
  else if (timeProperty == 0x8d) {
    (this->info).offset.internalTimeCode = propertyVal.internalTimeCode;
  }
  else {
    if (timeProperty == 0x94) {
      (this->info).inputDelay.internalTimeCode = propertyVal.internalTimeCode;
      return;
    }
    if (timeProperty == 0x96) {
      (this->info).outputDelay.internalTimeCode = propertyVal.internalTimeCode;
      return;
    }
  }
  return;
}

Assistant:

void TimeCoordinator::setProperty(int timeProperty, Time propertyVal)
{
    switch (timeProperty) {
        case defs::Properties::OUTPUT_DELAY:
            info.outputDelay = propertyVal;
            break;
        case defs::Properties::INPUT_DELAY:
            info.inputDelay = propertyVal;
            break;
        case defs::Properties::TIME_DELTA:
            info.timeDelta = propertyVal;
            if (info.timeDelta <= timeZero) {
                info.timeDelta = timeEpsilon;
            }
            break;
        case defs::Properties::PERIOD:
            info.period = propertyVal;
            break;
        case defs::Properties::OFFSET:
            info.offset = propertyVal;
            break;
        default:
            break;
    }
}